

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall
google::protobuf::RepeatedField<bool>::Resize(RepeatedField<bool> *this,int new_size,bool *value)

{
  int iVar1;
  
  if (this->current_size_ < new_size) {
    Reserve(this,new_size);
    iVar1 = this->current_size_;
    if (iVar1 != new_size) {
      memset((void *)((long)iVar1 + (long)this->arena_or_elements_),(uint)*value,
             (long)new_size - (long)iVar1);
    }
  }
  this->current_size_ = new_size;
  return;
}

Assistant:

inline void RepeatedField<Element>::Resize(int new_size, const Element& value) {
  GOOGLE_DCHECK_GE(new_size, 0);
  if (new_size > current_size_) {
    Reserve(new_size);
    std::fill(&elements()[current_size_], &elements()[new_size], value);
  }
  current_size_ = new_size;
}